

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nested.cpp
# Opt level: O3

void gather(NS *root,
           map<N_*,_NS_*,_std::less<N_*>,_std::allocator<std::pair<N_*const,_NS_*>_>_> *all)

{
  long *plVar1;
  N *local_68;
  anon_class_16_2_de2d2116 local_60;
  long *local_50;
  long *local_48;
  
  NS::it(root);
  if (local_50 != local_48) {
    plVar1 = local_50;
    do {
      local_68 = (N *)*plVar1;
      local_60.all = all;
      local_60.n = &local_68;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Adam-Vandervorst[P]NestedT/src/Nested.cpp:8:40)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>_&>
        ::_S_vtable._M_arr
        [*(__index_type *)
          ((long)&(local_68->data).
                  super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_NS_*>
                  .super__Move_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*>.
                  super__Copy_assign_alias<std::__cxx11::basic_string<char>,_int,_double,_NS_*> +
          0x20)]._M_data)(&local_60,&local_68->data);
      plVar1 = plVar1 + 1;
    } while (plVar1 != local_48);
  }
  return;
}

Assistant:

void gather(NS* root, map<N*, NS*>& all) {
    root->it().foreach([&](N* n){visit([&](auto &&data){
        if constexpr (is_same_v<decay_t<decltype(data)>, NS*>) {
            all.insert({n, data});

            cout << "subgraph cluster" << show(data) << "{" << endl;
            cout << "label=\"\";" << endl;
            cout << show(n) << " [style=invis, shape=point, margin=0];\n";
            gather(data, all);
            cout << "}" << endl;
        } else {
            all.insert({n, nullptr});
            cout << show(n) << " [label=" << *n << "];\n";
        }
    }, n->data);});
}